

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.cc
# Opt level: O2

void __thiscall double_conversion::Bignum::MultiplyByUInt64(Bignum *this,uint64_t factor)

{
  short sVar1;
  uint uVar2;
  ushort uVar3;
  ulong uVar4;
  ushort uVar5;
  ulong uVar6;
  ulong uVar7;
  
  if (factor != 1) {
    if (factor == 0) {
      this->used_bigits_ = 0;
      this->exponent_ = 0;
    }
    else {
      uVar3 = this->used_bigits_;
      if (uVar3 != 0) {
        uVar4 = 0;
        uVar5 = 0;
        if (0 < (short)uVar3) {
          uVar5 = uVar3;
        }
        uVar6 = 0;
        for (; uVar5 != uVar4; uVar4 = uVar4 + 1) {
          uVar2 = this->bigits_buffer_[uVar4];
          uVar7 = (ulong)((uint)uVar6 & 0xfffffff) + (factor & 0xffffffff) * (ulong)uVar2;
          this->bigits_buffer_[uVar4] = (uint)uVar7 & 0xfffffff;
          uVar6 = (ulong)uVar2 * (factor >> 0x1c & 0xfffffffffffffff0) + (uVar6 >> 0x1c) +
                  (uVar7 >> 0x1c);
        }
        for (; uVar6 != 0; uVar6 = uVar6 >> 0x1c) {
          EnsureCapacity((short)uVar3 + 1);
          sVar1 = this->used_bigits_;
          this->bigits_buffer_[sVar1] = (uint)uVar6 & 0xfffffff;
          uVar3 = sVar1 + 1;
          this->used_bigits_ = uVar3;
        }
      }
    }
  }
  return;
}

Assistant:

void Bignum::MultiplyByUInt64(const uint64_t factor) {
  if (factor == 1) {
    return;
  }
  if (factor == 0) {
    Zero();
    return;
  }
  if (used_bigits_ == 0) {
    return;
  }
  DOUBLE_CONVERSION_ASSERT(kBigitSize < 32);
  uint64_t carry = 0;
  const uint64_t low = factor & 0xFFFFFFFF;
  const uint64_t high = factor >> 32;
  for (int i = 0; i < used_bigits_; ++i) {
    const uint64_t product_low = low * RawBigit(i);
    const uint64_t product_high = high * RawBigit(i);
    const uint64_t tmp = (carry & kBigitMask) + product_low;
    RawBigit(i) = tmp & kBigitMask;
    carry = (carry >> kBigitSize) + (tmp >> kBigitSize) +
        (product_high << (32 - kBigitSize));
  }
  while (carry != 0) {
    EnsureCapacity(used_bigits_ + 1);
    RawBigit(used_bigits_) = carry & kBigitMask;
    used_bigits_++;
    carry >>= kBigitSize;
  }
}